

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void stresshashfunction<EasyUseSparseHashMap<HashObject<8,8>*,int,HashFn>>
               (int desired_insertions,int map_size,int stride)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  int j;
  int i;
  int n;
  char *key;
  int maxint;
  int o;
  EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn> set;
  int k;
  double total_nanoseconds;
  int num_insertions;
  Rusage t;
  key_type *in_stack_ffffffffffffff18;
  sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
  *in_stack_ffffffffffffff20;
  Rusage *in_stack_ffffffffffffff30;
  EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn> *in_stack_ffffffffffffff40;
  int local_b4;
  int local_b0;
  int local_8c;
  double local_28;
  int local_1c;
  
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff20);
  local_1c = 0;
  local_28 = 0.0;
  EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn>::EasyUseSparseHashMap
            (in_stack_ffffffffffffff40);
  for (local_8c = 0; local_8c < in_EDI / (int)in_ESI; local_8c = local_8c + 1) {
    google::
    sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
    ::clear((sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
             *)0x1d7d53);
    google::
    sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
    ::resize(in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
    Rusage::Reset((Rusage *)in_stack_ffffffffffffff20);
    iVar1 = (int)in_ESI / (int)(0x7fffffff / (long)(int)in_EDX) + 1;
    for (local_b0 = 0; local_b0 < iVar1; local_b0 = local_b0 + 1) {
      for (local_b4 = 0; local_b4 < (int)in_ESI / iVar1; local_b4 = local_b4 + 1) {
        local_1c = local_1c + 1;
        in_stack_ffffffffffffff30 =
             (Rusage *)
             google::
             sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
             ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        *(int *)&(in_stack_ffffffffffffff30->start_).__d.__r = local_1c;
      }
    }
    in_stack_ffffffffffffff20 =
         (sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          *)Rusage::UserTime(in_stack_ffffffffffffff30);
    local_28 = (double)in_stack_ffffffffffffff20 + local_28;
  }
  printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",local_28 / (double)local_1c,
         (ulong)in_ESI,(ulong)in_EDX);
  EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn>::~EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn> *)0x1d7f0a);
  return;
}

Assistant:

static void stresshashfunction(int desired_insertions, int map_size,
                               int stride) {
  Rusage t;
  int num_insertions = 0;
  // One measurement of user time (in nanoseconds) is done for each iteration of
  // the outer loop.  The times are summed.
  double total_nanoseconds = 0;
  const int k = desired_insertions / map_size;
  MapType set;
  for (int o = 0; o < k; o++) {
    set.clear();
    set.resize(map_size);
    t.Reset();
    const int maxint = (1ull << (sizeof(int) * 8 - 1)) - 1;
    // Use n arithmetic sequences.  Using just one may lead to overflow
    // if stride * map_size > maxint.  Compute n by requiring
    // stride * map_size/n < maxint, i.e., map_size/(maxint/stride) < n
    char* key;  // something we can do math on
    const int n = map_size / (maxint / stride) + 1;
    for (int i = 0; i < n; i++) {
      key = NULL;
      key += i;
      for (int j = 0; j < map_size / n; j++) {
        key += stride;
        set[reinterpret_cast<typename MapType::key_type>(key)] =
            ++num_insertions;
      }
    }
    total_nanoseconds += t.UserTime();
  }
  printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",
         map_size, stride, total_nanoseconds / num_insertions);
}